

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Vocoder.cpp
# Opt level: O1

int Vocoder::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  void *pvVar1;
  
  pvVar1 = (state->field_0).field_0.effectdata;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = Vocoder::EffectData]")
    ;
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    if (6U >= (uint)index) {
      *(float *)((long)pvVar1 + (ulong)(uint)index * 4) = value;
    }
    return (uint)(6U < (uint)index);
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = Vocoder::EffectData]");
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index < 0 || index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        return UNITY_AUDIODSP_OK;
    }